

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeLower(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *newLower,bool scale)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  pointer pnVar3;
  undefined7 in_register_00000011;
  long lVar4;
  int i;
  ulong uVar5;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  undefined4 local_80;
  undefined1 local_7c;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  if ((int)CONCAT71(in_register_00000011,scale) != 0) {
    lVar4 = 0x30;
    for (uVar5 = 0;
        (long)uVar5 <
        (long)(int)(((long)(this->
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).low.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).low.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x38); uVar5 = uVar5 + 1) {
      pnVar3 = (newLower->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_88 = *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar4 + -0x10);
      puVar1 = (undefined4 *)((long)(pnVar3->m_backend).data._M_elems + lVar4 + -0x30);
      local_a8 = *puVar1;
      uStack_a4 = puVar1[1];
      uStack_a0 = puVar1[2];
      uStack_9c = puVar1[3];
      puVar1 = (undefined4 *)((long)(pnVar3->m_backend).data._M_elems + lVar4 + -0x20);
      local_98 = *puVar1;
      uStack_94 = puVar1[1];
      uStack_90 = puVar1[2];
      uStack_8c = puVar1[3];
      local_80 = *(undefined4 *)((long)(pnVar3->m_backend).data._M_elems + lVar4 + -8);
      local_7c = *(undefined1 *)((long)(pnVar3->m_backend).data._M_elems + lVar4 + -4);
      local_78 = *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar4);
      (*this->lp_scaler->_vptr_SPxScaler[0x2b])
                (&local_68,this->lp_scaler,this,uVar5 & 0xffffffff,&local_a8);
      pnVar3 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar4 + -0x10) = local_48;
      puVar2 = (undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar4 + -0x20);
      *puVar2 = local_58;
      puVar2[1] = uStack_50;
      puVar2 = (undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar4 + -0x30);
      *puVar2 = local_68;
      puVar2[1] = uStack_60;
      *(undefined4 *)((long)(pnVar3->m_backend).data._M_elems + lVar4 + -8) = local_40;
      *(undefined1 *)((long)(pnVar3->m_backend).data._M_elems + lVar4 + -4) = local_3c;
      *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar4) = local_38;
      lVar4 = lVar4 + 0x38;
    }
    return;
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low,newLower);
  return;
}

Assistant:

virtual void changeLower(const VectorBase<R>& newLower, bool scale = false)
   {
      assert(lower().dim() == newLower.dim());

      if(scale)
      {
         assert(_isScaled);
         assert(lp_scaler);

         for(int i = 0; i < lower().dim(); i++)
            LPColSetBase<R>::lower_w(i) = lp_scaler->scaleLower(*this, i, newLower[i]);
      }
      else
         LPColSetBase<R>::lower_w() = newLower;

      assert(isConsistent());
   }